

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void sockaddr_to_netaddr(sockaddr *src,NETADDR *dst)

{
  undefined8 uVar1;
  
  if (src->sa_family == 10) {
    dst->type = 0;
    dst->ip[0] = '\0';
    dst->ip[1] = '\0';
    dst->ip[2] = '\0';
    dst->ip[3] = '\0';
    dst->ip[4] = '\0';
    dst->ip[5] = '\0';
    dst->ip[6] = '\0';
    dst->ip[7] = '\0';
    dst->ip[8] = '\0';
    dst->ip[9] = '\0';
    dst->ip[10] = '\0';
    dst->ip[0xb] = '\0';
    *(undefined8 *)(dst->ip + 0xc) = 0;
    dst->type = 2;
    dst->port = *(ushort *)src->sa_data << 8 | *(ushort *)src->sa_data >> 8;
    uVar1 = *(undefined8 *)(src + 1);
    *(undefined8 *)dst->ip = *(undefined8 *)(src->sa_data + 6);
    *(undefined8 *)(dst->ip + 8) = uVar1;
    return;
  }
  if (src->sa_family == 2) {
    dst->type = 0;
    dst->ip[0] = '\0';
    dst->ip[1] = '\0';
    dst->ip[2] = '\0';
    dst->ip[3] = '\0';
    dst->ip[4] = '\0';
    dst->ip[5] = '\0';
    dst->ip[6] = '\0';
    dst->ip[7] = '\0';
    dst->ip[8] = '\0';
    dst->ip[9] = '\0';
    dst->ip[10] = '\0';
    dst->ip[0xb] = '\0';
    *(undefined8 *)(dst->ip + 0xc) = 0;
    dst->type = 1;
    dst->port = *(ushort *)src->sa_data << 8 | *(ushort *)src->sa_data >> 8;
    *(undefined4 *)dst->ip = *(undefined4 *)(src->sa_data + 2);
    return;
  }
  dst->type = 0;
  dst->ip[0] = '\0';
  dst->ip[1] = '\0';
  dst->ip[2] = '\0';
  dst->ip[3] = '\0';
  dst->ip[4] = '\0';
  dst->ip[5] = '\0';
  dst->ip[6] = '\0';
  dst->ip[7] = '\0';
  dst->ip[8] = '\0';
  dst->ip[9] = '\0';
  dst->ip[10] = '\0';
  dst->ip[0xb] = '\0';
  dbg_msg("system","couldn\'t convert sockaddr of family %d",(ulong)src->sa_family);
  return;
}

Assistant:

static void sockaddr_to_netaddr(const struct sockaddr *src, NETADDR *dst)
{
	if(src->sa_family == AF_INET)
	{
		mem_zero(dst, sizeof(NETADDR));
		dst->type = NETTYPE_IPV4;
		dst->port = htons(((struct sockaddr_in*)src)->sin_port);
		mem_copy(dst->ip, &((struct sockaddr_in*)src)->sin_addr.s_addr, 4);
	}
	else if(src->sa_family == AF_INET6)
	{
		mem_zero(dst, sizeof(NETADDR));
		dst->type = NETTYPE_IPV6;
		dst->port = htons(((struct sockaddr_in6*)src)->sin6_port);
		mem_copy(dst->ip, &((struct sockaddr_in6*)src)->sin6_addr.s6_addr, 16);
	}
	else
	{
		mem_zero(dst, sizeof(struct sockaddr));
		dbg_msg("system", "couldn't convert sockaddr of family %d", src->sa_family);
	}
}